

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O2

int ImageInput::open(char *__file,int __oflag,...)

{
  _Rb_tree_node_base *__x;
  long lVar1;
  long *plVar2;
  size_type sVar3;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar4;
  int iVar5;
  stringstream *this;
  iterator iVar6;
  ImageInput *pIVar7;
  int *piVar8;
  char *pcVar9;
  __normal_iterator<ImageInput_*(**)(),_std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>_>
  _Var10;
  _Rb_tree_node_base *p_Var11;
  runtime_error *prVar12;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RCX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_00;
  pointer __old_p;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  stringstream *local_3e0;
  allocator<char> local_3d1;
  Creator createFunction;
  string specificError;
  vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_> formatsTried;
  char *local_390;
  size_type local_388;
  char local_380;
  uint7 uStack_37f;
  undefined8 uStack_378;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_370;
  string format;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2c8;
  string sn;
  undefined8 local_288;
  undefined8 uStack_280;
  string local_278;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_258;
  ifstream ifs;
  byte abStack_218 [488];
  
  if ((Imageio::inputFormats_abi_cxx11_._40_8_ == 0) &&
     (Imageio::catalogBuiltinPlugins(), Imageio::inputFormats_abi_cxx11_._40_8_ == 0)) {
    __assert_fail("!Imageio::inputFormats.empty() && \"No image input plugins compiled in.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageinput.cc"
                  ,0x25,
                  "static std::unique_ptr<ImageInput> ImageInput::open(const std::string &, const ImageSpec *, WarningCallbackFunction)"
                 );
  }
  std::ifstream::ifstream(&ifs);
  local_3e0 = (stringstream *)0x0;
  createFunction = (Creator)0x0;
  this_00 = &sn;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,"stdin",(allocator<char> *)&format);
  iVar5 = std::__cxx11::string::compare((char *)___oflag);
  if (iVar5 == 0) {
    std::istream::seekg(&std::cin,0,0);
    if (((byte)__gmon_start__[*(long *)(std::cin + -0x18)] & 5) != 0) {
      this = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(this);
      if (local_3e0 != (stringstream *)0x0) {
        lVar1 = *(long *)local_3e0;
        local_3e0 = this;
        (**(code **)(lVar1 + 8))();
        this = local_3e0;
      }
      local_3e0 = this;
      std::ostream::operator<<
                (local_3e0 + 0x10,*(streambuf **)(*(long *)(std::cin + -0x18) + 0x1ab6b8));
      std::istream::seekg((long)local_3e0,_S_beg);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_390,(string *)___oflag);
    specificError._M_dataplus._M_p = (pointer)&specificError.field_2;
    if (local_390 == &local_380) {
      specificError.field_2._8_8_ = uStack_378;
    }
    else {
      specificError._M_dataplus._M_p = local_390;
    }
    specificError.field_2._M_allocated_capacity = (ulong)uStack_37f << 8;
    specificError._M_string_length = local_388;
    local_388 = 0;
    local_380 = '\0';
    local_390 = &local_380;
    std::filesystem::__cxx11::path::path((path *)&format,(string_type *)&specificError,auto_format);
    std::ifstream::open((char *)&ifs,(_Ios_Openmode)format.super_string._M_dataplus._M_p);
    std::filesystem::__cxx11::path::~path((path *)&format);
    std::__cxx11::string::~string((string *)&specificError);
    std::__cxx11::string::~string((string *)&local_390);
    if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      format.super_string._M_dataplus._M_p = (___oflag->_M_dataplus)._M_p;
      format.super_string._M_string_length._0_5_ = (undefined5)___oflag->_M_string_length;
      format.super_string._M_string_length._5_3_ = (undefined3)(___oflag->_M_string_length >> 0x28);
      format.super_string.field_2._M_allocated_capacity._0_5_ = SUB85(pcVar9,0);
      format.super_string.field_2._M_allocated_capacity._5_3_ = (undefined3)((ulong)pcVar9 >> 0x28);
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x17;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&format;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&specificError,(v10 *)"Open of \"{}\" failed. {}",fmt,args);
      std::runtime_error::runtime_error(prVar12,(string *)&specificError);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::rfind((char)___oflag,0x2e);
    std::__cxx11::string::substr((ulong)&specificError,(ulong)___oflag);
    std::__cxx11::string::string((string *)&format,(string *)&specificError);
    std::__cxx11::string::~string((string *)&specificError);
    Imageio::string::tolower(&local_278,(int)&format);
    std::__cxx11::string::~string((string *)&local_278);
    if ((CONCAT35(format.super_string._M_string_length._5_3_,
                  (undefined5)format.super_string._M_string_length) != 0) &&
       (iVar6 = Imageio::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                        *)Imageio::inputFormats_abi_cxx11_,&format.super_string),
       iVar6._M_node != (_Base_ptr)(Imageio::inputFormats_abi_cxx11_ + 8))) {
      createFunction = *(Creator *)(iVar6._M_node + 2);
    }
    std::__cxx11::string::~string((string *)&format);
    this_00 = ___oflag;
  }
  formatsTried.super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specificError._M_dataplus._M_p = (pointer)&specificError.field_2;
  specificError._M_string_length = 0;
  formatsTried.super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  formatsTried.super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __file[0] = '\0';
  __file[1] = '\0';
  __file[2] = '\0';
  __file[3] = '\0';
  __file[4] = '\0';
  __file[5] = '\0';
  __file[6] = '\0';
  __file[7] = '\0';
  specificError.field_2._M_allocated_capacity =
       specificError.field_2._M_allocated_capacity & 0xffffffffffffff00;
  p_Var11 = (_Rb_tree_node_base *)Imageio::inputFormats_abi_cxx11_._24_8_;
  pfVar4 = in_RCX;
  if (createFunction == (Creator)0x0) {
    while( true ) {
      local_370 = pfVar4;
      sVar3 = specificError._M_string_length;
      if (p_Var11 == (_Rb_tree_node_base *)(Imageio::inputFormats_abi_cxx11_ + 8)) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        if (sVar3 != 0) {
          std::runtime_error::runtime_error(prVar12,(string *)&specificError);
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar5 = std::__cxx11::string::compare((char *)___oflag);
        if (iVar5 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"the data on stdin",&local_3d1);
        }
        else {
          std::__cxx11::string::string((string *)&local_2e8,(string *)___oflag);
        }
        local_288 = local_2e8;
        uStack_280 = uStack_2e0;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x5d;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_288;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&format,
                   (v10 *)
                   "No image plugin recognized the format of \"{}\". Is it a file format that we don\'t know about?\n"
                   ,fmt_00,args_00);
        std::runtime_error::runtime_error(prVar12,(string *)&format);
        __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __x = p_Var11 + 2;
      _Var10 = std::
               __find_if<__gnu_cxx::__normal_iterator<ImageInput*(**)(),std::vector<ImageInput*(*)(),std::allocator<ImageInput*(*)()>>>,__gnu_cxx::__ops::_Iter_equals_val<ImageInput*(*const)()>>
                         (formatsTried.
                          super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          formatsTried.
                          super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>.
                          _M_impl.super__Vector_impl_data._M_finish,__x);
      if (_Var10._M_current ==
          formatsTried.super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>.
          _M_impl.super__Vector_impl_data._M_finish) break;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      pfVar4 = local_370;
    }
    Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::push_back
              (&formatsTried,(value_type *)__x);
    createFunction = *(Creator *)__x;
    pIVar7 = (*createFunction)();
    plVar2 = *(long **)__file;
    *(ImageInput **)__file = pIVar7;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_258,local_370);
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&pIVar7->sendWarning,&local_258);
    std::_Function_base::~_Function_base((_Function_base *)&local_258);
    format.super_string._M_dataplus._M_p = (pointer)0x0;
    format.super_string._M_string_length._0_5_ = 0;
    format.super_string._M_string_length._5_3_ = 0;
    format.super_string.field_2._M_allocated_capacity._0_5_ = 0;
    format.super_string.field_2._8_4_ = 0xbf800000;
    open(pIVar7,(char *)this_00,(int)&ifs,&local_3e0,&format);
  }
  else {
    Imageio::std::vector<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::push_back
              (&formatsTried,&createFunction);
    pIVar7 = (*createFunction)();
    *(ImageInput **)__file = pIVar7;
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_2c8,in_RCX);
    Imageio::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&pIVar7->sendWarning,&local_2c8);
    std::_Function_base::~_Function_base((_Function_base *)&local_2c8);
    format.super_string._M_dataplus._M_p = (pointer)0x0;
    format.super_string._M_string_length._0_5_ = 0;
    format.super_string._M_string_length._5_3_ = 0;
    format.super_string.field_2._M_allocated_capacity._0_5_ = 0;
    format.super_string.field_2._8_4_ = 0xbf800000;
    open(pIVar7,(char *)this_00,(int)&ifs,&local_3e0,&format);
  }
  FormatDescriptor::~FormatDescriptor((FormatDescriptor *)&format);
  std::__cxx11::string::~string((string *)&specificError);
  Imageio::std::_Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>::~_Vector_base
            (&formatsTried.super__Vector_base<ImageInput_*(*)(),_std::allocator<ImageInput_*(*)()>_>
            );
  std::__cxx11::string::~string((string *)&sn);
  if (local_3e0 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_3e0 + 8))();
  }
  std::ifstream::~ifstream(&ifs);
  return (int)__file;
}

Assistant:

std::unique_ptr<ImageInput>
ImageInput::open(const std::string& filename,
                 const ImageSpec* /*config*/,
                 WarningCallbackFunction wcb)
                 //Filesystem::IOProxy* ioproxy, string_view plugin_searchpath)
{
    // Populate inputFormats.
    if (Imageio::inputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::inputFormats.empty() && "No image input plugins compiled in.");
    }

    std::ifstream ifs;
    std::unique_ptr<std::stringstream> buffer;
    ImageInput::Creator createFunction = nullptr;
    const std::string* fn;
    const std::string sn("stdin");
    bool doBuffer = true;

    if (filename.compare("-")) {
        // Regular file.
        // Check file exists, before looking for a suitable plugin.
        // MS's STL has `open` overloads that accept wchar_t to handle
        // Window's Unicode file names.
        ifs.open(std::filesystem::path(DecodeUTF8Path(filename)), std::ios::binary | std::ios::in);
        if (ifs.fail()) {
            throw std::runtime_error(
                fmt::format("Open of \"{}\" failed. {}",
                            filename, strerror(errno))
            );
        }

        // Extract the file extension from the filename (without the leading dot)
        Imageio::string format = filename.substr(filename.find_last_of('.')+1);
        format.tolower();

        // Look for a plugin for that extension.
        if (!format.empty()) {
            // First try the plug-in that matches the extension
            Imageio::InputPluginMap::const_iterator found
                       = Imageio::inputFormats.find(format);
            if (found != Imageio::inputFormats.end()) {
                createFunction = found->second;
            }
        }
        fn = &filename;
    } else {
        // cin (stdin)
#if defined(_WIN32)
        // Set "stdin" to have binary mode. There is no way to this via cin.
        (void)_setmode( _fileno( stdin ), _O_BINARY );
        // Windows shells set the FILE_SYNCHRONOUS_IO_NONALERT option when
        // creating pipes. Cygwin since 3.4.x does the same thing, a change
        // which affects anything dependent on it, e.g. Git for Windows
        // (since 2.41.0) and MSYS2. When this option is set, cin.seekg(0)
        // erroneously returns success. Always buffer.
        doBuffer = true;
#else
        // Can we seek in this cin?
        std::cin.seekg(0);
        doBuffer = std::cin.fail();
#endif
        if (doBuffer) {
            // Can't seek. Buffer stdin. This is a potentially large buffer.
            // Must avoid copy. If use stack variable for ss, it's streambuf
            // will also be on the stack and lost after this function exits
            // even with std::move.
            buffer =
                std::unique_ptr<std::stringstream>(new std::stringstream);
            *buffer << std::cin.rdbuf();
            buffer->seekg(0, std::ios::beg);
        }
        fn = &sn;
    }

    // Remember which formats we've already tried, so we don't double dip.
    std::vector<ImageInput::Creator> formatsTried;
    std::string specificError;
    std::unique_ptr<ImageInput> in;

    if (createFunction) {
        formatsTried.push_back(createFunction);
        // Try our guess.
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (const std::runtime_error& e) {
            // Oops, it failed.  Apparently, this file can't be
            // opened with this II.
            if (in) {
                specificError = e.what();
                in.reset();
            }
        }
    }

    // A plugin designated for the requested extension either couldn't be
    // found or was unable to open the file or there is no requested extension
    // due to stdin. Try every plugin and see if one will open the file.
    for (auto&& plugin : Imageio::inputFormats) {
        // If we already tried this create function, don't do it again
        if (std::find(formatsTried.begin(), formatsTried.end(), plugin.second)
            != formatsTried.end()) {
            continue;
        }
        formatsTried.push_back(plugin.second);  // remember
        createFunction = plugin.second;
        try {
            in = std::unique_ptr<ImageInput>(createFunction());
            in->connectCallback(wcb);
            ImageSpec tmpspec;
            in->open(*fn, ifs, buffer, tmpspec);
            return in;
        } catch (...) {
            if (in.get()) in.reset();
            continue;
        }
    }

    if (!specificError.empty()) {
        // Pass along any specific error message we got from our
        // best guess of the format.
        throw std::runtime_error(specificError);
    } else {
        throw std::runtime_error(
            fmt::format(
                "No image plugin recognized the format of \"{}\". "
                "Is it a file format that we don't know about?\n",
                filename.compare("-") ? filename : "the data on stdin")
            );
    }
}